

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

path * __thiscall
ArgsManager::GetDataDir(path *__return_storage_ptr__,ArgsManager *this,bool net_specific)

{
  string arg;
  char cVar1;
  CBaseChainParams *pCVar2;
  path *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  path datadir;
  ArgsManager *pAVar3;
  bool bVar4;
  undefined1 in_stack_ffffffffffffff21 [23];
  undefined1 local_b0 [40];
  long local_88;
  path local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  pAVar3 = this;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff18);
  this_00 = &(this->m_cached_datadir_path).super_path;
  if (net_specific) {
    this_00 = &(this->m_cached_network_datadir_path).super_path;
  }
  if ((this_00->_M_pathname)._M_string_length != 0) {
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,this_00);
    goto LAB_0013f990;
  }
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"-datadir","");
  local_68._M_pathname.field_2._M_allocated_capacity = 0;
  local_68._M_pathname.field_2._8_8_ = 0;
  local_68._M_pathname._M_dataplus._M_p = (char *)0x0;
  local_68._M_pathname._M_string_length = 0;
  local_68._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&local_68);
  arg._M_string_length._0_1_ = bVar4;
  arg._M_dataplus._M_p = (pointer)pAVar3;
  arg._9_23_ = in_stack_ffffffffffffff21;
  GetPathArg((path *)(local_b0 + 0x20),this,arg,(path *)local_b0);
  std::filesystem::__cxx11::path::~path(&local_68);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (local_88 == 0) {
    GetDefaultDataDir();
    if (&local_68 != this_00) {
      GetDataDir();
    }
    std::filesystem::__cxx11::path::~path(&local_68);
LAB_0013f917:
    if (net_specific) {
      pCVar2 = BaseParams();
      if ((pCVar2->strDataDir)._M_string_length != 0) {
        pCVar2 = BaseParams();
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_68,&pCVar2->strDataDir,auto_format);
        std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff28,&local_68);
        std::filesystem::__cxx11::path::~path(&local_68);
        std::filesystem::__cxx11::path::operator/=(this_00,(path *)&stack0xffffffffffffff28);
        std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff28);
      }
    }
  }
  else {
    std::filesystem::absolute(&local_68);
    std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff28,&local_68);
    std::filesystem::__cxx11::path::~path(&local_68);
    if ((path *)&stack0xffffffffffffff28 != this_00) {
      GetDataDir();
    }
    std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff28);
    cVar1 = std::filesystem::status(this_00);
    if (cVar1 == '\x02') goto LAB_0013f917;
    local_68._M_pathname._M_dataplus._M_p = "";
    std::filesystem::__cxx11::path::operator=(this_00,(char **)&local_68);
  }
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,this_00);
  std::filesystem::__cxx11::path::~path((path *)(local_b0 + 0x20));
LAB_0013f990:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

fs::path ArgsManager::GetDataDir(bool net_specific) const
{
    LOCK(cs_args);
    fs::path& path = net_specific ? m_cached_network_datadir_path : m_cached_datadir_path;

    // Used cached path if available
    if (!path.empty()) return path;

    const fs::path datadir{GetPathArg("-datadir")};
    if (!datadir.empty()) {
        path = fs::absolute(datadir);
        if (!fs::is_directory(path)) {
            path = "";
            return path;
        }
    } else {
        path = GetDefaultDataDir();
    }

    if (net_specific && !BaseParams().DataDir().empty()) {
        path /= fs::PathFromString(BaseParams().DataDir());
    }

    return path;
}